

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_file_system.cpp
# Opt level: O3

unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> __thiscall
duckdb::VirtualFileSystem::ExtractSubSystem(VirtualFileSystem *this,string *name)

{
  _Head_base<0UL,_duckdb::FileSystem_*,_false> _Var1;
  undefined1 *puVar2;
  int iVar3;
  iterator iVar4;
  pointer pFVar5;
  key_type *in_RDX;
  long lVar6;
  unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> *this_00;
  bool bVar7;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  iVar4 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)((long)&name[2].field_2 + 8),in_RDX);
  if ((iVar4.
       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
       ._M_cur == (__node_type *)0x0) &&
     (this_00 = (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> *)
                name->_M_string_length,
     this_00 !=
     (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> *)
     (name->field_2)._M_allocated_capacity)) {
    lVar6 = -(long)this_00;
    do {
      pFVar5 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
               operator->(this_00);
      (*pFVar5->_vptr_FileSystem[0x27])(&local_50,pFVar5);
      puVar2 = local_50;
      if (local_48 == in_RDX->_M_string_length) {
        if (local_48 == 0) {
          bVar7 = true;
        }
        else {
          iVar3 = bcmp(local_50,(in_RDX->_M_dataplus)._M_p,local_48);
          bVar7 = iVar3 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if (puVar2 != local_40) {
        operator_delete(puVar2);
      }
      if (bVar7) {
        _Var1._M_head_impl =
             (this_00->
             super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)._M_t.
             super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
             super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl;
        (this_00->super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>).
        _M_t.super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
        super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl = (FileSystem *)0x0;
        std::
        vector<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>
        ::_M_erase((vector<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>
                    *)&name->_M_string_length,
                   (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> *)
                   -lVar6);
        (this->super_FileSystem)._vptr_FileSystem = (_func_int **)_Var1._M_head_impl;
        return (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>)this;
      }
      this_00 = this_00 + 1;
      lVar6 = lVar6 + -8;
    } while (this_00 !=
             (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> *)
             (name->field_2)._M_allocated_capacity);
  }
  (this->super_FileSystem)._vptr_FileSystem = (_func_int **)0x0;
  return (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)
         (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)this;
}

Assistant:

unique_ptr<FileSystem> VirtualFileSystem::ExtractSubSystem(const string &name) {
	// If the subsystem has been disabled, we don't allow extraction and return nullptr here.
	if (disabled_file_systems.find(name) != disabled_file_systems.end()) {
		return nullptr;
	}

	unique_ptr<FileSystem> extracted_filesystem;
	for (auto iter = sub_systems.begin(); iter != sub_systems.end(); ++iter) {
		auto &cur_filesystem = *iter;
		if (cur_filesystem->GetName() == name) {
			extracted_filesystem = std::move(cur_filesystem);
			sub_systems.erase(iter);
			return extracted_filesystem;
		}
	}

	// Requested subfilesystem is not registered.
	return nullptr;
}